

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# formatter.cpp
# Opt level: O3

void jsonnet::internal::fodder_fill
               (ostream *o,Fodder *fodder,bool space_before,bool separate_token,bool final)

{
  Kind KVar1;
  pointer pbVar2;
  bool bVar3;
  undefined4 uVar4;
  undefined7 in_register_00000009;
  ulong uVar5;
  size_type sVar6;
  uint uVar7;
  undefined3 in_register_00000081;
  undefined4 uVar8;
  string *l;
  pointer pbVar9;
  pointer pFVar10;
  long lVar11;
  long *local_70;
  long local_68;
  long local_60 [2];
  uint local_4c;
  undefined4 local_48;
  undefined4 local_44;
  Fodder *local_40;
  pointer local_38;
  
  uVar8 = CONCAT31(in_register_00000081,final);
  uVar5 = CONCAT71(in_register_00000009,separate_token);
  pFVar10 = (fodder->
            super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_38 = (fodder->
             super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (pFVar10 != local_38) {
    local_4c = (uint)uVar5;
    uVar7 = 0;
    lVar11 = 0;
    local_48 = uVar8;
    local_40 = fodder;
    do {
      if ((char)uVar8 == '\0') {
        uVar4 = 0;
      }
      else {
        uVar4 = (undefined4)
                CONCAT71(0xcccccccccccccc,
                         lVar11 == ((long)(fodder->
                                          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                          )._M_impl.super__Vector_impl_data._M_finish -
                                    (long)(fodder->
                                          super__Vector_base<jsonnet::internal::FodderElement,_std::allocator<jsonnet::internal::FodderElement>_>
                                          )._M_impl.super__Vector_impl_data._M_start >> 3) *
                                   -0x3333333333333333 + -1);
      }
      KVar1 = pFVar10->kind;
      if (KVar1 == PARAGRAPH) {
        pbVar9 = (pFVar10->comment).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pbVar2 = (pFVar10->comment).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        local_44 = uVar4;
        if (pbVar9 != pbVar2) {
          bVar3 = true;
          do {
            sVar6 = pbVar9->_M_string_length;
            if (sVar6 != 0) {
              if (!bVar3) {
                local_70 = local_60;
                std::__cxx11::string::_M_construct((ulong)&local_70,(char)uVar7);
                std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_70,local_68);
                if (local_70 != local_60) {
                  operator_delete(local_70,local_60[0] + 1);
                }
                sVar6 = pbVar9->_M_string_length;
              }
              std::__ostream_insert<char,std::char_traits<char>>(o,(pbVar9->_M_dataplus)._M_p,sVar6)
              ;
            }
            local_70 = (long *)CONCAT71(local_70._1_7_,10);
            std::__ostream_insert<char,std::char_traits<char>>(o,(char *)&local_70,1);
            pbVar9 = pbVar9 + 1;
            bVar3 = false;
          } while (pbVar9 != pbVar2);
        }
        fodder = local_40;
        uVar8 = local_48;
        if ((char)local_44 == '\0') {
          local_70 = local_60;
          std::__cxx11::string::_M_construct((ulong)&local_70,(char)pFVar10->blanks);
          std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_70,local_68);
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
          local_70 = local_60;
          std::__cxx11::string::_M_construct((ulong)&local_70,(char)pFVar10->indent);
          std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_70,local_68);
LAB_00162051:
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
        }
LAB_0016206d:
        uVar7 = pFVar10->indent;
        space_before = false;
      }
      else if (KVar1 == INTERSTITIAL) {
        if ((space_before & 1U) != 0) {
          local_70 = (long *)CONCAT71(local_70._1_7_,0x20);
          std::__ostream_insert<char,std::char_traits<char>>(o,(char *)&local_70,1);
        }
        pbVar9 = (pFVar10->comment).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        std::__ostream_insert<char,std::char_traits<char>>
                  (o,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        space_before = true;
      }
      else if (KVar1 == LINE_END) {
        if ((pFVar10->comment).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish !=
            (pFVar10->comment).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start) {
          std::__ostream_insert<char,std::char_traits<char>>(o,"  ",2);
          pbVar9 = (pFVar10->comment).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          std::__ostream_insert<char,std::char_traits<char>>
                    (o,(pbVar9->_M_dataplus)._M_p,pbVar9->_M_string_length);
        }
        local_70 = (long *)CONCAT71(local_70._1_7_,10);
        std::__ostream_insert<char,std::char_traits<char>>(o,(char *)&local_70,1);
        if ((char)uVar4 == '\0') {
          local_70 = local_60;
          std::__cxx11::string::_M_construct((ulong)&local_70,(char)pFVar10->blanks);
          std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_70,local_68);
          if (local_70 != local_60) {
            operator_delete(local_70,local_60[0] + 1);
          }
          local_70 = local_60;
          std::__cxx11::string::_M_construct((ulong)&local_70,(char)pFVar10->indent);
          std::__ostream_insert<char,std::char_traits<char>>(o,(char *)local_70,local_68);
          goto LAB_00162051;
        }
        goto LAB_0016206d;
      }
      lVar11 = lVar11 + 1;
      pFVar10 = pFVar10 + 1;
    } while (pFVar10 != local_38);
    uVar5 = (ulong)local_4c;
  }
  if (((byte)uVar5 & space_before) != 0) {
    local_70 = (long *)CONCAT71(local_70._1_7_,0x20);
    std::__ostream_insert<char,std::char_traits<char>>(o,(char *)&local_70,1);
  }
  return;
}

Assistant:

void fodder_fill(std::ostream &o, const Fodder &fodder, bool space_before, bool separate_token, bool final)
{
    unsigned last_indent = 0;
    size_t index = 0;
    for (const auto &fod : fodder) {
        bool skip_trailing = final && (index == (fodder.size() - 1));
        switch (fod.kind) {
            case FodderElement::LINE_END:
                if (fod.comment.size() > 0)
                    o << "  " << fod.comment[0];
                o << '\n';
                if (!skip_trailing) {
                    o << std::string(fod.blanks, '\n');
                    o << std::string(fod.indent, ' ');
                }
                last_indent = fod.indent;
                space_before = false;
                break;

            case FodderElement::INTERSTITIAL:
                if (space_before)
                    o << ' ';
                o << fod.comment[0];
                space_before = true;
                break;

            case FodderElement::PARAGRAPH: {
                bool first = true;
                for (const std::string &l : fod.comment) {
                    // Do not indent empty lines (note: first line is never empty).
                    if (l.length() > 0) {
                        // First line is already indented by previous fod.
                        if (!first)
                            o << std::string(last_indent, ' ');
                        o << l;
                    }
                    o << '\n';
                    first = false;
                }
                if (!skip_trailing) {
                    o << std::string(fod.blanks, '\n');
                    o << std::string(fod.indent, ' ');
                }
                last_indent = fod.indent;
                space_before = false;
            } break;
        }
        ++index;
    }
    if (separate_token && space_before)
        o << ' ';
}